

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O2

bool __thiscall
uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::check
          (uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *src,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *des)

{
  __type _Var1;
  uint uVar2;
  int iVar3;
  _List_node_base *p_Var4;
  
  iVar3 = 0;
  p_Var4 = (_List_node_base *)&this->path;
  while (p_Var4 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)&this->path) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var4 + 1),src);
    uVar2 = 1;
    if (!_Var1) {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var4 + 1),des);
      uVar2 = (uint)_Var1;
    }
    iVar3 = iVar3 + uVar2;
  }
  return iVar3 == 2;
}

Assistant:

bool check(ver src, ver des) {//check if path is possible
      int f = 0;
      for (auto &v : path)
        f += v == src || v == des;
      return f == 2;
    }